

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::ZoneVectorBase::_reserve
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  void *__src;
  uint uVar1;
  void *__dest;
  Error EVar2;
  ulong uVar3;
  size_t allocatedBytes;
  
  uVar1 = this->_capacity;
  EVar2 = 0;
  if (uVar1 < n) {
    if ((n <= n * sizeOfT) &&
       (__dest = ZoneAllocator::alloc(allocator,(ulong)(n * sizeOfT),&allocatedBytes),
       __dest != (void *)0x0)) {
      __src = this->_data;
      uVar3 = (ulong)sizeOfT;
      if ((ulong)this->_size != 0) {
        memcpy(__dest,__src,this->_size * uVar3);
      }
      if (__src != (void *)0x0) {
        ZoneAllocator::release(allocator,__src,uVar1 * uVar3);
      }
      uVar1 = (uint)(allocatedBytes / uVar3);
      this->_capacity = uVar1;
      if (n <= uVar1) {
        this->_data = __dest;
        return 0;
      }
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zonevector.cpp"
                 ,0x4b,"_capacity >= n");
    }
    EVar2 = 1;
  }
  return EVar2;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  uint32_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorOutOfMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(allocator->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorOutOfMemory);

  void* oldData = _data;
  if (_size)
    memcpy(newData, oldData, size_t(_size) * sizeOfT);

  if (oldData)
    allocator->release(oldData, size_t(oldCapacity) * sizeOfT);

  _capacity = uint32_t(allocatedBytes / sizeOfT);
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}